

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::CipherListsEqual
               (SSL_CTX *ctx,
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               *expected)

{
  uint uVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  SSL_CIPHER *pSVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  sk = (OPENSSL_STACK *)SSL_CTX_get_ciphers(ctx);
  sVar3 = OPENSSL_sk_num(sk);
  if (sVar3 == (long)(expected->
                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(expected->
                     super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) {
    bVar9 = (expected->
            super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
            )._M_impl.super__Vector_impl_data._M_finish ==
            (expected->
            super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
            )._M_impl.super__Vector_impl_data._M_start;
    if (!bVar9) {
      pSVar4 = (SSL_CIPHER *)OPENSSL_sk_value(sk,0);
      uVar7 = ((expected->
               super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               )._M_impl.super__Vector_impl_data._M_start)->id;
      uVar5 = SSL_CIPHER_get_id(pSVar4);
      if (uVar7 == (uVar5 & 0xffffffff)) {
        uVar7 = 1;
        lVar8 = 0;
        do {
          uVar1 = *(uint *)((long)&((expected->
                                    super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->in_group_flag +
                           lVar8);
          iVar2 = SSL_CTX_cipher_in_group(ctx,uVar7 - 1);
          if (uVar1 != (iVar2 != 0)) {
            return bVar9;
          }
          bVar9 = (ulong)((long)(expected->
                                super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(expected->
                                super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7;
          if (bVar9) {
            return bVar9;
          }
          pSVar4 = (SSL_CIPHER *)OPENSSL_sk_value(sk,uVar7);
          uVar5 = *(ulong *)((long)&(expected->
                                    super__Vector_base<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].id + lVar8);
          uVar6 = SSL_CIPHER_get_id(pSVar4);
          lVar8 = lVar8 + 0x10;
          uVar7 = uVar7 + 1;
        } while (uVar5 == (uVar6 & 0xffffffff));
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

static bool CipherListsEqual(SSL_CTX *ctx,
                             const std::vector<ExpectedCipher> &expected) {
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  if (sk_SSL_CIPHER_num(ciphers) != expected.size()) {
    return false;
  }

  for (size_t i = 0; i < expected.size(); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (expected[i].id != SSL_CIPHER_get_id(cipher) ||
        expected[i].in_group_flag != !!SSL_CTX_cipher_in_group(ctx, i)) {
      return false;
    }
  }

  return true;
}